

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O1

iterator __thiscall
fmt::v5::formatter<std::chrono::duration<int,_std::ratio<1L,_100L>_>,_char,_void>::parse
          (formatter<std::chrono::duration<int,_std::ratio<1L,_100L>_>,_char,_void> *this,
          basic_parse_context<char,_fmt::v5::internal::error_handler> *ctx)

{
  char *end;
  byte bVar1;
  char cVar2;
  size_t sVar3;
  bool bVar4;
  char *pcVar5;
  ulong uVar6;
  alignment aVar7;
  uint uVar8;
  char *begin;
  spec_handler handler;
  spec_handler local_40;
  width_adapter<fmt::v5::formatter<std::chrono::duration<int,_std::ratio<1L,_100L>_>,_char,_void>::spec_handler_&,_char>
  local_30;
  
  begin = (ctx->format_str_).data_;
  sVar3 = (ctx->format_str_).size_;
  pcVar5 = begin;
  if (sVar3 != 0) {
    end = begin + sVar3;
    pcVar5 = begin + 1;
    uVar6 = (ulong)(sVar3 != 1);
    do {
      bVar1 = begin[uVar6];
      aVar7 = ALIGN_DEFAULT;
      bVar4 = true;
      if (bVar1 < 0x3e) {
        if (bVar1 == 0x3c) {
          aVar7 = ALIGN_LEFT;
          goto LAB_00120fea;
        }
        if (bVar1 == 0x3d) {
          aVar7 = ALIGN_NUMERIC;
          goto LAB_00120fea;
        }
      }
      else {
        if (bVar1 == 0x3e) {
          aVar7 = ALIGN_RIGHT;
        }
        else {
          if (bVar1 != 0x5e) goto LAB_00120fec;
          aVar7 = ALIGN_CENTER;
        }
LAB_00120fea:
        bVar4 = false;
      }
LAB_00120fec:
      local_40.f = this;
      local_40.context = ctx;
      if (!bVar4) {
        if (0 < (long)uVar6) {
          cVar2 = *begin;
          if (cVar2 == L'{') {
            spec_handler::on_error(&local_40,"invalid fill character \'{\'");
            pcVar5 = begin;
          }
          else {
            pcVar5 = begin + 2;
            (this->spec).fill_ = (int)cVar2;
          }
          if (cVar2 == '{') break;
        }
        ((local_40.f)->spec).align_ = aVar7;
        begin = pcVar5;
        break;
      }
      bVar4 = 0 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar4);
    pcVar5 = begin;
    if (begin != end) {
      cVar2 = *begin;
      if ((byte)(cVar2 - 0x30U) < 10) {
        begin = begin + 1;
        uVar8 = 0;
        pcVar5 = begin;
        if (cVar2 != '0') {
          while (uVar8 < 0xccccccd) {
            uVar8 = ((int)pcVar5[-1] + uVar8 * 10) - 0x30;
            begin = end;
            if ((pcVar5 == end) ||
               (cVar2 = *pcVar5, begin = pcVar5, pcVar5 = pcVar5 + 1, 9 < (byte)(cVar2 - 0x30U)))
            goto LAB_001210e6;
          }
          uVar8 = 0x80000000;
          begin = pcVar5 + -1;
LAB_001210e6:
          if ((int)uVar8 < 0) {
            spec_handler::on_error(&local_40,"number is too big");
          }
        }
        ((local_40.f)->spec).width_ = uVar8;
      }
      else if (cVar2 == '{') {
        begin = begin + 1;
        if (begin != end) {
          local_30.handler = &local_40;
          begin = internal::
                  parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::formatter<std::chrono::duration<int,std::ratio<1l,100l>>,char,void>::spec_handler&,char>>
                            (begin,end,&local_30);
        }
        if ((begin == end) || (*begin != '}')) {
          spec_handler::on_error(&local_40,"invalid format string");
        }
        else {
          begin = begin + 1;
        }
      }
      pcVar5 = internal::parse_chrono_format<char,fmt::v5::internal::chrono_format_checker>
                         (begin,end,(chrono_format_checker *)&local_30);
      (this->format_str).data_ = begin;
      (this->format_str).size_ = (long)pcVar5 - (long)begin;
    }
  }
  return pcVar5;
}

Assistant:

make_arg_ref(internal::auto_id) {
      return arg_ref_type(context.next_arg_id());
    }